

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void GPU_RemoveWindowMapping(Uint32 windowID)

{
  GPU_WindowMapping *__dest;
  long lVar1;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    _gpu_window_mappings_size = 10;
    _gpu_window_mappings = (GPU_WindowMapping *)SDL_malloc(0xa0);
    _gpu_num_window_mappings = 0;
  }
  if ((windowID != 0) && (0 < (long)_gpu_num_window_mappings)) {
    lVar1 = 0;
    __dest = _gpu_window_mappings;
    do {
      if (__dest->windowID == windowID) {
        __dest->target->context->windowID = 0;
        _gpu_num_window_mappings = _gpu_num_window_mappings - 1;
        if ((int)((ulong)(uint)_gpu_num_window_mappings - lVar1) < 1) {
          return;
        }
        memmove(__dest,__dest + 1,((ulong)(uint)_gpu_num_window_mappings - lVar1 & 0xffffffff) << 4)
        ;
        return;
      }
      lVar1 = lVar1 + 1;
      __dest = __dest + 1;
    } while (_gpu_num_window_mappings != lVar1);
  }
  return;
}

Assistant:

void GPU_RemoveWindowMapping(Uint32 windowID)
{
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(windowID == 0)  // Invalid window ID
        return;

    // Find the occurrence
    for(i = 0; i < _gpu_num_window_mappings; i++)
    {
        if(_gpu_window_mappings[i].windowID == windowID)
        {
            int num_to_move;

            // Unset the target's window
            _gpu_window_mappings[i].target->context->windowID = 0;

            // Move the remaining entries to replace the removed one
            _gpu_num_window_mappings--;
            num_to_move = _gpu_num_window_mappings - i;
            if(num_to_move > 0)
                memmove(&_gpu_window_mappings[i], &_gpu_window_mappings[i+1], num_to_move * sizeof(GPU_WindowMapping));
            return;
        }
    }

}